

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

void __thiscall cmFileCopier::MatchRule::MatchRule(MatchRule *this,string *regex)

{
  char *s;
  string *regex_local;
  MatchRule *this_local;
  
  s = (char *)std::__cxx11::string::c_str();
  cmsys::RegularExpression::RegularExpression(&this->Regex,s);
  MatchProperties::MatchProperties(&this->Properties);
  std::__cxx11::string::string((string *)&this->RegexString,(string *)regex);
  return;
}

Assistant:

MatchRule(std::string const& regex):
      Regex(regex.c_str()), RegexString(regex) {}